

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

float calculateEdginess(Mat *inputImg)

{
  int iVar1;
  int iVar2;
  _InputArray *p_Var3;
  byte *pbVar4;
  int local_328;
  int local_324;
  int j;
  int i;
  _InputArray local_308;
  _InputArray local_2f0;
  Mat local_2d8 [8];
  Mat grad;
  int local_2cc;
  _OutputArray local_278;
  _InputArray local_260;
  _OutputArray local_248;
  _InputArray local_230;
  _OutputArray local_218;
  _InputArray local_200;
  _OutputArray local_1e8;
  _InputArray local_1c0;
  int local_1a4;
  int local_1a0;
  int delta;
  int scale;
  int kernelSize;
  Mat abs_grad_y;
  Mat local_138 [8];
  Mat abs_grad_x;
  Mat local_d8 [8];
  Mat grad_y;
  Mat local_78 [8];
  Mat grad_x;
  float local_14;
  float sum;
  float numOfBlurry;
  Mat *inputImg_local;
  
  local_14 = 0.0;
  cv::Mat::Mat(local_78);
  cv::Mat::Mat(local_d8);
  cv::Mat::Mat(local_138);
  cv::Mat::Mat((Mat *)&scale);
  delta = 3;
  local_1a0 = 1;
  local_1a4 = 0;
  cv::_InputArray::_InputArray(&local_1c0,inputImg);
  cv::_OutputArray::_OutputArray(&local_1e8,local_78);
  cv::Sobel(&local_1c0,&local_1e8,0,1,0,delta,(double)local_1a0,(double)local_1a4,4);
  cv::_OutputArray::~_OutputArray(&local_1e8);
  cv::_InputArray::~_InputArray(&local_1c0);
  cv::_InputArray::_InputArray(&local_200,local_78);
  cv::_OutputArray::_OutputArray(&local_218,local_138);
  cv::convertScaleAbs(&local_200,&local_218,1.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_218);
  cv::_InputArray::~_InputArray(&local_200);
  cv::_InputArray::_InputArray(&local_230,inputImg);
  cv::_OutputArray::_OutputArray(&local_248,local_d8);
  cv::Sobel(&local_230,&local_248,0,0,1,delta,(double)local_1a0,(double)local_1a4,4);
  cv::_OutputArray::~_OutputArray(&local_248);
  cv::_InputArray::~_InputArray(&local_230);
  cv::_InputArray::_InputArray(&local_260,local_d8);
  cv::_OutputArray::_OutputArray(&local_278,(Mat *)&scale);
  cv::convertScaleAbs(&local_260,&local_278,1.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_278);
  cv::_InputArray::~_InputArray(&local_260);
  cv::Mat::Mat(local_2d8);
  cv::_InputArray::_InputArray(&local_2f0,local_138);
  cv::_InputArray::_InputArray(&local_308,(Mat *)&scale);
  cv::_OutputArray::_OutputArray((_OutputArray *)&j,local_2d8);
  p_Var3 = (_InputArray *)cv::noArray();
  cv::add(&local_2f0,&local_308,(_OutputArray *)&j,p_Var3,-1);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&j);
  cv::_InputArray::~_InputArray(&local_308);
  cv::_InputArray::~_InputArray(&local_2f0);
  for (local_324 = 0; local_324 < _grad; local_324 = local_324 + 1) {
    for (local_328 = 0; local_328 < local_2cc; local_328 = local_328 + 1) {
      cv::Mat::at<unsigned_char>(local_2d8,local_324,local_328);
      pbVar4 = cv::Mat::at<unsigned_char>(local_2d8,local_324,local_328);
      if (*pbVar4 < 0x14) {
        local_14 = local_14 + 1.0;
      }
    }
  }
  iVar1 = *(int *)(inputImg + 8);
  iVar2 = *(int *)(inputImg + 0xc);
  cv::Mat::~Mat(local_2d8);
  cv::Mat::~Mat((Mat *)&scale);
  cv::Mat::~Mat(local_138);
  cv::Mat::~Mat(local_d8);
  cv::Mat::~Mat(local_78);
  return (local_14 / (float)(iVar1 * iVar2)) * 100.0;
}

Assistant:

float calculateEdginess(Mat inputImg) {
    float numOfBlurry = 0.0;
    float sum = 0;
    Mat grad_x, grad_y;
    Mat abs_grad_x, abs_grad_y;
    int kernelSize = 3, scale = 1, delta = 0;

    Sobel( inputImg, grad_x, CV_8U, 1, 0, kernelSize, scale, delta, BORDER_DEFAULT );
    convertScaleAbs( grad_x, abs_grad_x );

    Sobel( inputImg, grad_y, CV_8U, 0, 1, kernelSize, scale, delta, BORDER_DEFAULT );
    convertScaleAbs( grad_y, abs_grad_y );

    Mat grad;

    add(abs_grad_x, abs_grad_y, grad);

    for (int i = 0; i < grad.rows; i ++) {
        for (int j = 0; j < grad.cols; j++) {
            sum += (int)(grad.at<uchar>(i,j));
            if ( (int)(grad.at<uchar>(i,j))  < 20) {
                numOfBlurry++;
            }
        }
    }
    return ( numOfBlurry/ (inputImg.rows * inputImg.cols) ) * 100;
}